

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseSerializers.h
# Opt level: O3

bool __thiscall
tonk::protocol::P2PConnectParams::Write(P2PConnectParams *this,WriteByteStream *stream)

{
  undefined2 uVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  uint8_t uVar7;
  bytes_type addrData;
  uint uVar8;
  uint8_t uVar9;
  uint uVar10;
  
  uVar5 = stream->BufferBytes - stream->WrittenBytes;
  if (0x20 < uVar5) {
    uVar9 = (uint8_t)*(undefined4 *)this + '\x02';
    if ((this->PeerExternalAddress).impl_.data_.base.sa_family == 2) {
      uVar9 = (uint8_t)*(undefined4 *)this;
    }
    uVar7 = uVar9 + '\x04';
    if (this->PeerNATMappedPort == 0) {
      uVar7 = uVar9;
    }
    stream->Data[stream->WrittenBytes] = uVar7;
    uVar2 = stream->WrittenBytes;
    puVar3 = stream->Data;
    *(uint64_t *)(puVar3 + (uVar2 + 1)) = this->EncryptionKey;
    *(uint16_t *)(puVar3 + (uVar2 + 9)) = this->ProtocolRoundIntervalMsec;
    *(uint16_t *)(puVar3 + (uVar2 + 0xb)) = this->ShotTS16;
    *(uint16_t *)(puVar3 + (uVar2 + 0xd)) = this->SelfExternalPort;
    uVar10 = uVar2 + 0xf;
    stream->WrittenBytes = uVar10;
    uVar8 = uVar10;
    if (this->PeerNATMappedPort != 0) {
      uVar8 = uVar2 + 0x11;
      *(uint16_t *)(puVar3 + uVar10) = this->PeerNATMappedPort;
      stream->WrittenBytes = uVar8;
    }
    uVar10 = uVar8 + 2;
    uVar1 = swap_bytes((this->PeerExternalAddress).impl_.data_.v4.sin_port);
    *(undefined2 *)(puVar3 + uVar8) = uVar1;
    stream->WrittenBytes = uVar10;
    if ((this->PeerExternalAddress).impl_.data_.base.sa_family == 2) {
      *(in_addr_t *)(puVar3 + uVar10) = (this->PeerExternalAddress).impl_.data_.v4.sin_addr.s_addr;
      iVar6 = 4;
    }
    else {
      uVar4 = *(undefined8 *)((long)&(this->PeerExternalAddress).impl_.data_ + 0x10);
      *(undefined8 *)(puVar3 + uVar10) =
           *(undefined8 *)((long)&(this->PeerExternalAddress).impl_.data_ + 8);
      *(undefined8 *)(puVar3 + uVar10 + 8) = uVar4;
      iVar6 = 0x10;
    }
    stream->WrittenBytes = stream->WrittenBytes + iVar6;
  }
  return 0x20 < uVar5;
}

Assistant:

SIAMESE_FORCE_INLINE unsigned Remaining()
    {
        SIAMESE_DEBUG_ASSERT(WrittenBytes <= BufferBytes);
        return BufferBytes - WrittenBytes;
    }